

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges
          (EnvironmentNAVXYTHETALAT *this,
          vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *changedcellsV,
          vector<int,_std::allocator<int>_> *preds_of_changededgesIDV)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  long lVar6;
  long *__x;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_RSI;
  long in_RDI;
  int sind;
  int i;
  EnvNAVXYTHETALATHashEntry_t *affectedHashEntry;
  sbpl_xy_theta_cell_t affectedcell;
  sbpl_2Dcell_t cell;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_ffffffffffffff98;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_ffffffffffffffa0;
  int iVar7;
  int iVar8;
  int local_40;
  int local_3c;
  sbpl_xy_theta_cell_t local_30;
  value_type local_20 [2];
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *local_10;
  
  local_10 = in_RSI;
  sbpl_2Dcell_t::sbpl_2Dcell_t(local_20);
  sbpl_xy_theta_cell_t::sbpl_xy_theta_cell_t(&local_30);
  *(int *)(in_RDI + 0x170) = *(int *)(in_RDI + 0x170) + 1;
  local_3c = 0;
  while (iVar8 = local_3c,
        sVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::size(local_10),
        iVar8 < (int)sVar3) {
    pvVar4 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                       (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    local_20[0] = *pvVar4;
    local_40 = 0;
    while (iVar7 = local_40,
          sVar3 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                            ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                             (in_RDI + 0x158)), iVar7 < (int)sVar3) {
      pvVar5 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                         ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                          in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      local_30.theta = pvVar5->theta;
      uVar1 = pvVar5->x;
      uVar2 = pvVar5->y;
      local_30.y = uVar2 + local_20[0].y;
      local_30.x = uVar1 + local_20[0].x;
      in_stack_ffffffffffffffa0 =
           *(vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> **)(in_RDI + 0x1c0);
      __x = (long *)(in_RDI + *(long *)(in_RDI + 0x1c8));
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffffa0;
      if (((ulong)in_stack_ffffffffffffffa0 & 1) != 0) {
        in_stack_ffffffffffffff98 =
             *(vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> **)
              ((long)in_stack_ffffffffffffffa0 + *__x + -1);
      }
      lVar6 = (*(code *)in_stack_ffffffffffffff98)
                        (__x,uVar1 + local_20[0].x,uVar2 + local_20[0].y,local_30.theta);
      if ((lVar6 != 0) && (*(int *)(lVar6 + 0x10) < *(int *)(in_RDI + 0x170))) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar8,iVar7),
                   (value_type_conflict1 *)__x);
        *(undefined4 *)(lVar6 + 0x10) = *(undefined4 *)(in_RDI + 0x170);
      }
      local_40 = local_40 + 1;
    }
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges(
    std::vector<nav2dcell_t> const* changedcellsV,
    std::vector<int>* preds_of_changededgesIDV)
{
    nav2dcell_t cell;
    sbpl_xy_theta_cell_t affectedcell;
    EnvNAVXYTHETALATHashEntry_t* affectedHashEntry;

    // increment iteration for processing savings
    iteration++;

    for (int i = 0; i < (int)changedcellsV->size(); i++) {
        cell = changedcellsV->at(i);

        // now iterate over all states that could potentially be affected
        for (int sind = 0; sind < (int)affectedpredstatesV.size(); sind++) {
            affectedcell = affectedpredstatesV.at(sind);

            // translate to correct for the offset
            affectedcell.x = affectedcell.x + cell.x;
            affectedcell.y = affectedcell.y + cell.y;

            // insert only if it was actually generated
            affectedHashEntry = (this->*GetHashEntry)(affectedcell.x, affectedcell.y, affectedcell.theta);
            if (affectedHashEntry != NULL && affectedHashEntry->iteration < iteration) {
                preds_of_changededgesIDV->push_back(affectedHashEntry->stateID);
                affectedHashEntry->iteration = iteration; // mark as already inserted
            }
        }
    }
}